

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_test.cc
# Opt level: O0

void re2::RegexpNamedCaptures(void)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  LogMessage local_858;
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [32];
  undefined1 local_688 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  want;
  LogMessage local_4d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_358;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *have;
  LogMessage local_1d0;
  StringPiece local_40;
  undefined1 local_30 [8];
  RegexpStatus status;
  Regexp *x;
  
  RegexpStatus::RegexpStatus((RegexpStatus *)local_30);
  StringPiece::StringPiece(&local_40,"(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)");
  status.tmp_ = (string *)Regexp::Parse(&local_40,PerlX,(RegexpStatus *)local_30);
  bVar2 = RegexpStatus::ok((RegexpStatus *)local_30);
  if (!bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x30);
    poVar4 = LogMessage::stream(&local_1d0);
    std::operator<<(poVar4,"Check failed: status.ok()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d0);
  }
  iVar3 = Regexp::NumCaptures((Regexp *)status.tmp_);
  if (iVar3 != 4) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&have,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x31);
    poVar4 = LogMessage::stream((LogMessage *)&have);
    std::operator<<(poVar4,"Check failed: (4) == (x->NumCaptures())");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&have);
  }
  local_358 = Regexp::NamedCaptures_abi_cxx11_((Regexp *)status.tmp_);
  if (local_358 ==
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x33);
    poVar4 = LogMessage::stream(&local_4d8);
    std::operator<<(poVar4,"Check failed: have != NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4d8);
  }
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::size(local_358);
  if (sVar5 != 2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&want._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x34);
    poVar4 = LogMessage::stream((LogMessage *)&want._M_t._M_impl.super__Rb_tree_header._M_node_count
                               );
    std::operator<<(poVar4,"Check failed: (2) == (have->size())");
    LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&want._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)local_688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"g1",&local_6a9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_688,(key_type *)local_6a8);
  *pmVar6 = 1;
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"g2",&local_6d1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_688,(key_type *)local_6d0);
  *pmVar6 = 3;
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  bVar2 = std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_688,local_358);
  if (!bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_858,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x39);
    poVar4 = LogMessage::stream(&local_858);
    std::operator<<(poVar4,"Check failed: (want) == (*have)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_858);
  }
  Regexp::Decref((Regexp *)status.tmp_);
  pmVar1 = local_358;
  if (local_358 !=
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       *)0x0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map(local_358);
    operator_delete(pmVar1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)local_688);
  RegexpStatus::~RegexpStatus((RegexpStatus *)local_30);
  return;
}

Assistant:

TEST(Regexp, NamedCaptures) {
  Regexp* x;
  RegexpStatus status;
  x = Regexp::Parse(
      "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)", Regexp::PerlX, &status);
  EXPECT_TRUE(status.ok());
  EXPECT_EQ(4, x->NumCaptures());
  const map<string, int>* have = x->NamedCaptures();
  EXPECT_TRUE(have != NULL);
  EXPECT_EQ(2, have->size());  // there are only two named groups in
                               // the regexp: 'g1' and 'g2'.
  map<string, int> want;
  want["g1"] = 1;
  want["g2"] = 3;
  EXPECT_EQ(want, *have);
  x->Decref();
  delete have;
}